

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int analysisLoader(void *pData,int argc,char **argv,char **NotUsed)

{
  byte *pbVar1;
  byte bVar2;
  sqlite3 *db;
  char *zDatabase;
  int iVar3;
  Table *pTVar4;
  Index *pIVar5;
  byte *__s1;
  tRowcnt tVar6;
  ulong uVar7;
  analysisInfo *pInfo;
  ulong uVar8;
  bool bVar9;
  
  if (((argv != (char **)0x0) && (*argv != (char *)0x0)) &&
     (__s1 = (byte *)argv[2], __s1 != (byte *)0x0)) {
    db = *pData;
    zDatabase = *(char **)((long)pData + 8);
    pTVar4 = sqlite3FindTable(db,*argv,zDatabase);
    if (pTVar4 != (Table *)0x0) {
      if (argv[1] == (char *)0x0) {
        pIVar5 = (Index *)0x0;
      }
      else {
        pIVar5 = sqlite3FindIndex(db,argv[1],zDatabase);
      }
      if (pIVar5 == (Index *)0x0) {
        uVar8 = 0;
      }
      else {
        uVar8 = (ulong)pIVar5->nColumn;
      }
      if (*__s1 != 0) {
        uVar7 = 0;
        while( true ) {
          tVar6 = 0;
          bVar2 = *__s1;
          while ((byte)(bVar2 - 0x30) < 10) {
            tVar6 = ((uint)bVar2 + tVar6 * 10) - 0x30;
            pbVar1 = __s1 + 1;
            __s1 = __s1 + 1;
            bVar2 = *pbVar1;
          }
          if (uVar7 == 0) {
            pTVar4->nRowEst = tVar6;
          }
          if (pIVar5 == (Index *)0x0) {
            return 0;
          }
          pIVar5->aiRowEst[uVar7] = tVar6;
          __s1 = __s1 + (*__s1 == 0x20);
          iVar3 = strcmp((char *)__s1,"unordered");
          if (iVar3 == 0) break;
          if (*__s1 == 0) {
            return 0;
          }
          bVar9 = uVar8 <= uVar7;
          uVar7 = uVar7 + 1;
          if (bVar9) {
            return 0;
          }
        }
        pIVar5->field_0x4f = pIVar5->field_0x4f | 4;
      }
    }
  }
  return 0;
}

Assistant:

static int analysisLoader(void *pData, int argc, char **argv, char **NotUsed){
  analysisInfo *pInfo = (analysisInfo*)pData;
  Index *pIndex;
  Table *pTable;
  int i, c, n;
  tRowcnt v;
  const char *z;

  assert( argc==3 );
  UNUSED_PARAMETER2(NotUsed, argc);

  if( argv==0 || argv[0]==0 || argv[2]==0 ){
    return 0;
  }
  pTable = sqlite3FindTable(pInfo->db, argv[0], pInfo->zDatabase);
  if( pTable==0 ){
    return 0;
  }
  if( argv[1] ){
    pIndex = sqlite3FindIndex(pInfo->db, argv[1], pInfo->zDatabase);
  }else{
    pIndex = 0;
  }
  n = pIndex ? pIndex->nColumn : 0;
  z = argv[2];
  for(i=0; *z && i<=n; i++){
    v = 0;
    while( (c=z[0])>='0' && c<='9' ){
      v = v*10 + c - '0';
      z++;
    }
    if( i==0 ) pTable->nRowEst = v;
    if( pIndex==0 ) break;
    pIndex->aiRowEst[i] = v;
    if( *z==' ' ) z++;
    if( strcmp(z, "unordered")==0 ){
      pIndex->bUnordered = 1;
      break;
    }
  }
  return 0;
}